

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp4.c
# Opt level: O0

ReturnCode expand(Global *global,DEFBUF *tokenp)

{
  int iVar1;
  ReturnCode RVar2;
  DEFBUF *in_RSI;
  Global *in_RDI;
  bool bVar3;
  ReturnCode ret;
  FILEINFO *file;
  int c;
  char *in_stack_ffffffffffffffa8;
  char *pcVar4;
  Global *in_stack_ffffffffffffffb0;
  Global *in_stack_ffffffffffffffb8;
  Global *in_stack_ffffffffffffffc0;
  Global *global_00;
  Global *in_stack_ffffffffffffffc8;
  ReturnCode local_2c;
  FILEINFO *local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_2c = FPP_OK;
  iVar1 = in_RDI->recursion;
  in_RDI->recursion = iVar1 + 1;
  if (iVar1 == 0) {
    in_RDI->macro = in_RSI;
  }
  else if ((in_RDI->recursion == 1000) &&
          (cerror(in_RDI,ERROR_RECURSIVE_MACRO,in_RSI->name,in_RDI->macro->name),
          in_RDI->rec_recover != 0)) {
    do {
      get(in_stack_ffffffffffffffc8);
      bVar3 = false;
      if (in_RDI->infile != (FILEINFO *)0x0) {
        bVar3 = in_RDI->infile->fp == (FILE *)0x0;
      }
    } while (bVar3);
    unget(in_stack_ffffffffffffffb0);
    in_RDI->recursion = 0;
    return FPP_OK;
  }
  in_RDI->nargs = 0;
  in_RDI->parmp = in_RDI->parm;
  switch(in_RSI->nargs) {
  case -5:
    sprintf(in_RDI->work,"%d",(ulong)(uint)in_RDI->funcline);
    local_2c = ungetstring(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
    break;
  case -4:
    if (*in_RDI->functionname == '\0') {
      pcVar4 = "<unknown function>";
    }
    else {
      pcVar4 = in_RDI->functionname;
    }
    sprintf(in_RDI->work,"\"%s\"",pcVar4);
    local_2c = ungetstring(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
    break;
  case -3:
    for (local_28 = in_RDI->infile; local_28 != (FILEINFO *)0x0; local_28 = local_28->parent) {
      if (local_28->fp != (FILE *)0x0) {
        global_00 = (Global *)in_RDI->work;
        if (local_28->progname == (char *)0x0) {
          pcVar4 = local_28->filename;
        }
        else {
          pcVar4 = local_28->progname;
        }
        sprintf((char *)global_00,"\"%s\"",pcVar4);
        RVar2 = ungetstring(global_00,pcVar4);
        return RVar2;
      }
    }
    break;
  case -2:
    if (in_RDI->infile->fp == (FILE *)0x0) {
      for (local_28 = in_RDI->infile; local_28 != (FILEINFO *)0x0; local_28 = local_28->parent) {
        if (local_28->fp != (FILE *)0x0) {
          sprintf(in_RDI->work,"%d",(ulong)(uint)local_28->line);
          break;
        }
      }
    }
    else {
      sprintf(in_RDI->work,"%d",(ulong)(uint)in_RDI->line);
    }
    local_2c = ungetstring(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
    break;
  default:
    if (in_RSI->nargs < 0) {
      cerror(in_RDI,FATAL_ILLEGAL_MACRO,in_RSI->name);
      return FPP_ILLEGAL_MACRO;
    }
    while (iVar1 = skipws(in_stack_ffffffffffffffb0), iVar1 == 10) {
      in_RDI->wrongline = 1;
    }
    if (iVar1 != 0x28) {
      unget(in_stack_ffffffffffffffb0);
      cerror(in_RDI,WARN_MACRO_NEEDS_ARGUMENTS,in_RSI->name);
      Putstring(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      return FPP_OK;
    }
    RVar2 = expcollect(in_stack_ffffffffffffffb8);
    if (RVar2 != FPP_OK) {
      return RVar2;
    }
    if (in_RSI->nargs != in_RDI->nargs) {
      cerror(in_RDI,WARN_WRONG_NUMBER_ARGUMENTS,in_RSI->name);
    }
  case -1:
    local_2c = expstuff((Global *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (char *)in_RDI,(char *)in_RSI);
  }
  return local_2c;
}

Assistant:

ReturnCode expand(struct Global *global, DEFBUF *tokenp)
{
  /*
   * Expand a macro.  Called from the cpp mainline routine (via subroutine
   * macroid()) when a token is found in the symbol table.  It calls
   * expcollect() to parse actual parameters, checking for the correct number.
   * It then creates a "file" containing a single line containing the
   * macro with actual parameters inserted appropriately.  This is
   * "pushed back" onto the input stream.  (When the get() routine runs
   * off the end of the macro line, it will dismiss the macro itself.)
   */
  int c;
  FILEINFO *file;
  ReturnCode ret=FPP_OK;
      
  /*
   * If no macro is pending, save the name of this macro
   * for an eventual error message.
   */
  if (global->recursion++ == 0)
    global->macro = tokenp;
  else if (global->recursion == RECURSION_LIMIT) {
    cerror(global, ERROR_RECURSIVE_MACRO, tokenp->name, global->macro->name);
    if (global->rec_recover) {
      do {
	c = get(global);
      } while (global->infile != NULL && global->infile->fp == NULL);
      unget(global);
      global->recursion = 0;
      return(FPP_OK);
    }
  }
  /*
   * Here's a macro to expand.
   */
  global->nargs = 0;			/* Formals counter	*/
  global->parmp = global->parm;		/* Setup parm buffer	*/
  switch (tokenp->nargs) {
  case (-2):                              /* __LINE__             */
      if(global->infile->fp)
	  /* This is a file */
	  sprintf(global->work, "%d", global->line);
      else
	  /* This is a macro! Find out the file line number! */
	  for (file = global->infile; file != NULL; file = file->parent) {
	      if (file->fp != NULL) {
		  sprintf(global->work, "%d", file->line);
		  break;
	      }
	  }
      ret=ungetstring(global, global->work);
      if(ret)
	  return(ret);
      break;
    
  case (-3):                              /* __FILE__             */
    for (file = global->infile; file != NULL; file = file->parent) {
      if (file->fp != NULL) {
	sprintf(global->work, "\"%s\"", (file->progname != NULL)
		? file->progname : file->filename);
	ret=ungetstring(global, global->work);
	if(ret)
	  return(ret);
	break;
      }
    }
    break;

  case (-4):				/* __FUNC__ */
    sprintf(global->work, "\"%s\"", global->functionname[0]?
	    global->functionname : "<unknown function>");
    ret=ungetstring(global, global->work);
    if(ret)
	return(ret);
    break;

  case (-5):                              /* __FUNC_LINE__ */
    sprintf(global->work, "%d", global->funcline);
    ret=ungetstring(global, global->work);
    if(ret)
      return(ret);
    break;

  default:
    /*
     * Nothing funny about this macro.
     */
    if (tokenp->nargs < 0) {
      cfatal(global, FATAL_ILLEGAL_MACRO, tokenp->name);
      return(FPP_ILLEGAL_MACRO);
    }
    while ((c = skipws(global)) == '\n')      /* Look for (, skipping */
      global->wrongline = TRUE;		/* spaces and newlines	*/
    if (c != '(') {
      /*
       * If the programmer writes
       *	#define foo() ...
       *	...
       *	foo [no ()]
       * just write foo to the output stream.
       */
      unget(global);
      cwarn(global, WARN_MACRO_NEEDS_ARGUMENTS, tokenp->name);

      /* fputs(tokenp->name, stdout); */
      Putstring(global, tokenp->name);
      return(FPP_OK);
    } else if (!(ret=expcollect(global))) {     /* Collect arguments    */
      if (tokenp->nargs != global->nargs) {     /* Should be an error?  */
	cwarn(global, WARN_WRONG_NUMBER_ARGUMENTS, tokenp->name);
      }
    } else {				/* Collect arguments		*/
      return(ret); /* We failed in argument colleting! */
    }
  case DEF_NOARGS:			/* No parameters just stuffs	*/
    ret=expstuff(global, tokenp->name, tokenp->repl); /* expand macro   */
  }					/* nargs switch 		*/
  return(ret);
}